

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

int32 gauden_dist_precompute(gauden_t *g,float32 varfloor)

{
  int iVar1;
  vector_t pfVar2;
  float32 ***pppfVar3;
  long lVar4;
  uint uVar5;
  float *pfVar6;
  long lVar7;
  double dVar8;
  long local_50;
  long local_48;
  
  pppfVar3 = (float32 ***)
             __ckd_calloc_3d__((long)g->n_mgau,(long)g->n_feat,(long)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                               ,0x157);
  g->det = pppfVar3;
  if (g->n_mgau < 1) {
    uVar5 = 0;
  }
  else {
    local_50 = 0;
    uVar5 = 0;
    do {
      if (0 < g->n_feat) {
        local_48 = 0;
        do {
          if (0 < g->n_density) {
            iVar1 = g->featlen[local_48];
            pfVar6 = (float *)g->det[local_50][local_48];
            lVar7 = 0;
            do {
              *pfVar6 = 0.0;
              if (0 < iVar1) {
                pfVar2 = g->var[local_50][local_48][lVar7];
                lVar4 = 0;
                do {
                  if ((float)pfVar2[lVar4] <= (float)varfloor &&
                      (float)varfloor != (float)pfVar2[lVar4]) {
                    pfVar2[lVar4] = varfloor;
                    uVar5 = uVar5 + 1;
                  }
                  dVar8 = log((double)(float)pfVar2[lVar4]);
                  *pfVar6 = (float)dVar8 + *pfVar6;
                  pfVar2[lVar4] = (float32)(1.0 / ((float)pfVar2[lVar4] + (float)pfVar2[lVar4]));
                  lVar4 = lVar4 + 1;
                } while (iVar1 != (int)lVar4);
              }
              *pfVar6 = (*pfVar6 + (float)iVar1 * 1.837877) * 0.5;
              lVar7 = lVar7 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar7 < g->n_density);
          }
          local_48 = local_48 + 1;
        } while (local_48 < g->n_feat);
      }
      local_50 = local_50 + 1;
    } while (local_50 < g->n_mgau);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0x17f,"%d variance values floored\n",(ulong)uVar5);
  return 0;
}

Assistant:

int32
gauden_dist_precompute(gauden_t * g, float32 varfloor)
{
    int32 i, m, f, d, flen;
    float32 *varp, *detp;
    int32 n;

    n = 0;
    /* Allocate space for determinants */
    g->det =
        (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
                                    sizeof(float32));

    /** FIX ME!, There is no removal of Gaussian in ms_mgau. This is
	not yet synchronized with cont_mgau's behavior. */

    for (m = 0; m < g->n_mgau; m++) {
        for (f = 0; f < g->n_feat; f++) {
            flen = g->featlen[f];

            /* Determinants for all variance vectors in g->[m][f] */
            for (d = 0, detp = g->det[m][f]; d < g->n_density; d++, detp++) {
                *detp = (float32) 0.0;

                for (i = 0, varp = g->var[m][f][d]; i < flen; i++, varp++) {
                    if (*varp < varfloor) {
#if 0
                        E_INFO
                            ("varp %f , floor %f n=%d, m %d, f %d c %d, i %d\n",
                             *varp, varfloor, n, m, f, d, i);
#endif
                        *varp = varfloor;
                        n++;
                    }

                    *detp += (float32) (log(*varp));

                    /* Precompute this part of the exponential */
                    *varp = (float32) (1.0 / (*varp * 2.0));
                }

                /* 2pi */
                *detp += (float32) (flen * log(2.0 * M_PI));

                /* Sqrt */
                *detp *= (float32) 0.5;
            }
        }
    }

    if (1)
        E_INFO("%d variance values floored\n", n);

    return 0;
}